

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SignExtLowering.cpp
# Opt level: O3

void __thiscall
wasm::SignExtLowering::lowerToShifts<int>
          (SignExtLowering *this,Expression *value,BinaryOp leftShift,BinaryOp rightShift,
          int originalBits)

{
  Const *pCVar1;
  Binary *this_00;
  Binary *this_01;
  Builder local_50;
  Builder builder;
  
  local_50.wasm =
       (this->
       super_WalkerPass<wasm::PostWalker<wasm::SignExtLowering,_wasm::Visitor<wasm::SignExtLowering,_void>_>_>
       ).super_PostWalker<wasm::SignExtLowering,_wasm::Visitor<wasm::SignExtLowering,_void>_>.
       super_Walker<wasm::SignExtLowering,_wasm::Visitor<wasm::SignExtLowering,_void>_>.currModule;
  builder.wasm = (Module *)value;
  pCVar1 = Builder::makeConst<int>(&local_50,0x20 - originalBits);
  this_00 = (Binary *)MixedArena::allocSpace(&(local_50.wasm)->allocator,0x28,8);
  (this_00->super_SpecificExpression<(wasm::Expression::Id)16>).super_Expression._id = BinaryId;
  (this_00->super_SpecificExpression<(wasm::Expression::Id)16>).super_Expression.type.id = 0;
  this_00->op = leftShift;
  this_00->left = (Expression *)builder.wasm;
  this_00->right = (Expression *)pCVar1;
  Binary::finalize(this_00);
  pCVar1 = Builder::makeConst<int>(&local_50,0x20 - originalBits);
  this_01 = (Binary *)MixedArena::allocSpace(&(local_50.wasm)->allocator,0x28,8);
  (this_01->super_SpecificExpression<(wasm::Expression::Id)16>).super_Expression._id = BinaryId;
  (this_01->super_SpecificExpression<(wasm::Expression::Id)16>).super_Expression.type.id = 0;
  this_01->op = rightShift;
  this_01->left = (Expression *)this_00;
  this_01->right = (Expression *)pCVar1;
  Binary::finalize(this_01);
  Walker<wasm::SignExtLowering,_wasm::Visitor<wasm::SignExtLowering,_void>_>::replaceCurrent
            (&(this->
              super_WalkerPass<wasm::PostWalker<wasm::SignExtLowering,_wasm::Visitor<wasm::SignExtLowering,_void>_>_>
              ).super_PostWalker<wasm::SignExtLowering,_wasm::Visitor<wasm::SignExtLowering,_void>_>
              .super_Walker<wasm::SignExtLowering,_wasm::Visitor<wasm::SignExtLowering,_void>_>,
             (Expression *)this_01);
  return;
}

Assistant:

void lowerToShifts(Expression* value,
                     BinaryOp leftShift,
                     BinaryOp rightShift,
                     T originalBits) {
    // To sign-extend, we shift all the way left so the effective sign bit is
    // where the actual sign bit is. For example, when sign-extending i8, the
    // effective sign bit is at bit 8, and we shift it to the actual place of
    // the sign bit, which is 32 for i32 or 64 for i64. Then we do a signed
    // shift in the other direction, which fills with the proper bit all the
    // way back, so e.g.
    //
    //  0x000000ff  =(shift left)=>  0xff000000  =(shift right)=>  0xffffffff
    //
    T shiftBits = (sizeof(T) * 8) - originalBits;
    Builder builder(*getModule());
    replaceCurrent(builder.makeBinary(
      rightShift,
      builder.makeBinary(leftShift, value, builder.makeConst(shiftBits)),
      builder.makeConst(shiftBits)));
  }